

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-split-pages.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined8 extraout_RAX;
  long *plVar3;
  ostream *poVar4;
  int extraout_EDX;
  QPDFPageObjectHelper *pQVar5;
  char *local_128;
  allocator<char> local_119;
  QPDF inpdf;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageObjectHelper *local_100;
  undefined1 local_e8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string outfile;
  QPDF outpdf;
  
  pcVar2 = (char *)QUtil::getWhoami(*argv);
  if (1 < argc) {
    iVar1 = strcmp(argv[1]," --static-id");
    if (iVar1 == 0) {
      argv = argv + 1;
      static_id = '\x01';
      argc = argc + -1;
    }
    if (argc == 3) {
      pcVar2 = argv[1];
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[2],&local_119);
      QPDF::QPDF(&inpdf);
      QPDF::processFile((char *)&inpdf,pcVar2);
      QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_e8,&inpdf);
      QPDFPageDocumentHelper::getAllPages();
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_e8);
      std::__cxx11::to_string((string *)local_e8,((long)local_100 - (long)_pages) / 0x38);
      outfile._M_dataplus._M_p = (pointer)local_e8._8_8_;
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&outfile);
      std::__cxx11::string::~string((string *)local_e8);
      iVar1 = 1;
      for (pQVar5 = _pages; pQVar5 != local_100; pQVar5 = pQVar5 + 1) {
        QUtil::int_to_string_abi_cxx11_((longlong)&outpdf,iVar1);
        std::operator+(&local_b0,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outpdf)
        ;
        std::operator+(&outfile,&local_b0,".pdf");
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&outpdf);
        QPDF::QPDF(&outpdf);
        QPDF::emptyPDF();
        QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_b0,&outpdf);
        QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)local_e8,pQVar5);
        QPDFPageDocumentHelper::addPage
                  ((QPDFPageObjectHelper *)&local_b0,SUB81((QPDFPageObjectHelper *)local_e8,0));
        QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_e8);
        QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_b0);
        QPDFWriter::QPDFWriter((QPDFWriter *)&local_b0,&outpdf,outfile._M_dataplus._M_p);
        if (static_id == '\x01') {
          QPDFWriter::setStaticID(SUB81(&local_b0,0));
          QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_b0);
        }
        QPDFWriter::write();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
        QPDF::~QPDF(&outpdf);
        std::__cxx11::string::~string((string *)&outfile);
        iVar1 = iVar1 + 1;
      }
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages);
      QPDF::~QPDF(&inpdf);
      std::__cxx11::string::~string((string *)&local_90);
      return 0;
    }
  }
  usage(pcVar2);
  std::__cxx11::string::~string((string *)local_e8);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages);
  QPDF::~QPDF(&inpdf);
  std::__cxx11::string::~string((string *)&local_90);
  if (extraout_EDX == 1) {
    plVar3 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar4 = std::operator<<((ostream *)&std::cerr,local_128);
    poVar4 = std::operator<<(poVar4,": exception: ");
    pcVar2 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
    poVar4 = std::operator<<(poVar4,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    __cxa_end_catch();
    return 2;
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    char const* whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (argc != 3) {
        usage(whoami);
    }
    try {
        process(whoami, argv[1], argv[2]);
    } catch (std::exception const& e) {
        std::cerr << whoami << ": exception: " << e.what() << std::endl;
        return 2;
    }
    return 0;
}